

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winmakefile.cpp
# Opt level: O1

void __thiscall Win32MakefileGenerator::writeRcFilePart(Win32MakefileGenerator *this,QTextStream *t)

{
  QMakeProject *pQVar1;
  Data *pDVar2;
  ProString *pPVar3;
  undefined8 uVar4;
  bool bVar5;
  CutResult CVar6;
  ProStringList *pPVar7;
  QTextStream *pQVar8;
  char16_t *pcVar9;
  ulong uVar10;
  long lVar11;
  char *pcVar12;
  long in_FS_OFFSET;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QStringView config;
  ProString defines;
  ProString res_file;
  QArrayData *local_220 [3];
  ProString local_208;
  ProKey local_1d8;
  QArrayData *local_1a0 [3];
  QArrayDataPointer<QString> local_188;
  QString local_168;
  QArrayDataPointer<QString> local_148;
  QArrayData *local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  QArrayDataPointer<ProString> local_108;
  undefined1 local_e8 [32];
  undefined1 *puStack_c8;
  undefined1 *local_c0;
  QString local_b8;
  undefined1 local_98 [28];
  int iStack_7c;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 local_68 [32];
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)local_68,"RC_FILE");
  pPVar7 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)local_68);
  lVar11 = (pPVar7->super_QList<ProString>).d.size;
  if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
    }
  }
  if (lVar11 != 0) {
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_68._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    pQVar1 = (this->super_MakefileGenerator).project;
    ProKey::ProKey((ProKey *)local_98,"RES_FILE");
    QMakeEvaluator::first((ProString *)local_68,&pQVar1->super_QMakeEvaluator,(ProKey *)local_98);
    if ((QArrayData *)local_98._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_98._0_8_,2,0x10);
      }
    }
    local_b8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_b8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_b8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar1 = (this->super_MakefileGenerator).project;
    ProKey::ProKey((ProKey *)local_e8,"RC_FILE");
    QMakeEvaluator::first((ProString *)local_98,&pQVar1->super_QMakeEvaluator,(ProKey *)local_e8);
    ProString::toQString((QString *)&local_1d8,(ProString *)local_98);
    MakefileGenerator::fileFixify
              (&local_b8,&this->super_MakefileGenerator,(QString *)&local_1d8,(FileFixifyTypes)0x0,
               true);
    if (&(local_1d8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_1d8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_1d8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_1d8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_1d8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((QArrayData *)local_98._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_98._0_8_,2,0x10);
      }
    }
    if ((QArrayData *)local_e8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_e8._0_8_,2,0x10);
      }
    }
    local_108.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_108.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_108.ptr = (ProString *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar1 = (this->super_MakefileGenerator).project;
    ProKey::ProKey((ProKey *)local_98,"RC_INCLUDEPATH");
    pPVar7 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)local_98);
    local_108.d = (pPVar7->super_QList<ProString>).d.d;
    local_108.ptr = (pPVar7->super_QList<ProString>).d.ptr;
    local_108.size = (pPVar7->super_QList<ProString>).d.size;
    if (local_108.d != (Data *)0x0) {
      LOCK();
      ((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if ((QArrayData *)local_98._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_98._0_8_,2,0x10);
      }
    }
    local_128 = (QArrayData *)0x0;
    uStack_120 = 0;
    local_118 = 0;
    if (local_108.size != 0) {
      lVar11 = 0;
      uVar10 = 0;
      do {
        pPVar3 = local_108.ptr;
        if (*(int *)((long)&(local_108.ptr)->m_length + lVar11) != 0) {
          local_98._0_8_ = (QArrayData *)0x0;
          local_98._8_8_ = L" /i ";
          local_98._16_8_ = (undefined1 *)0x4;
          QString::append((QString *)&local_128);
          if ((QArrayData *)local_98._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_98._0_8_,2,0x10);
            }
          }
          MakefileGenerator::escapeFilePath
                    ((ProString *)local_98,&this->super_MakefileGenerator,
                     (ProString *)((long)&(pPVar3->m_string).d.d + lVar11));
          uVar4 = local_98._8_8_;
          local_e8._0_8_ = SEXT48((int)local_98._24_4_);
          local_1d8.super_ProString.m_string.d.d = (Data *)(long)iStack_7c;
          CVar6 = QtPrivate::QContainerImplHelper::mid
                            (local_98._16_8_,(qsizetype *)local_e8,(qsizetype *)&local_1d8);
          if (CVar6 == Null) {
            pcVar9 = (char16_t *)0x0;
          }
          else {
            pcVar9 = (char16_t *)((long)&((DataPointer *)uVar4)->d + local_e8._0_8_ * 2);
          }
          QString::append((QChar *)&local_128,(longlong)pcVar9);
          if ((QArrayData *)local_98._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_98._0_8_,2,0x10);
            }
          }
        }
        uVar10 = uVar10 + 1;
        lVar11 = lVar11 + 0x30;
      } while (uVar10 < (ulong)local_108.size);
    }
    QMakeSourceFileInfo::addSourceFile((QMakeSourceFileInfo *)this,&local_b8,'\x01',TYPE_C);
    local_148.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_148.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_148.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    local_98._0_8_ = (Data *)0x0;
    local_98._8_8_ = (QString *)0x0;
    local_98._16_8_ = 0;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
              ((QMovableArrayOps<QString> *)local_98,0,&local_b8);
    QList<QString>::end((QList<QString> *)local_98);
    QMakeSourceFileInfo::dependencies((QStringList *)local_e8,(QMakeSourceFileInfo *)this,&local_b8)
    ;
    QList<QString>::operator+=((QList<QString> *)local_98,(QStringList *)local_e8);
    local_148.d = (Data *)local_98._0_8_;
    local_148.ptr = (QString *)local_98._8_8_;
    local_148.size = local_98._16_8_;
    if ((Data *)local_98._0_8_ != (Data *)0x0) {
      LOCK();
      (((QArrayData *)local_98._0_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_98._0_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)local_e8);
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)local_98);
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
    local_98._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    stack0xffffffffffffff80 = &DAT_aaaaaaaaaaaaaaaa;
    local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    ProKey::ProKey((ProKey *)local_e8,"RC_DEFINES");
    QVar13.m_data = (storage_type *)0x3;
    QVar13.m_size = (qsizetype)&local_1d8;
    QString::fromUtf8(QVar13);
    local_208.m_string.d.d = local_1d8.super_ProString.m_string.d.d;
    local_208.m_string.d.ptr = local_1d8.super_ProString.m_string.d.ptr;
    local_208.m_string.d.size = local_1d8.super_ProString.m_string.d.size;
    QVar14.m_data = (storage_type *)0x3;
    QVar14.m_size = (qsizetype)&local_1d8;
    QString::fromUtf8(QVar14);
    local_168.d.d = local_1d8.super_ProString.m_string.d.d;
    local_168.d.ptr = local_1d8.super_ProString.m_string.d.ptr;
    local_168.d.size = local_1d8.super_ProString.m_string.d.size;
    pcVar12 = "";
    QVar15.m_data = (storage_type *)0x0;
    QVar15.m_size = (qsizetype)&local_1d8;
    QString::fromUtf8(QVar15);
    local_188.d = (Data *)local_1d8.super_ProString.m_string.d.d;
    local_188.ptr = (QString *)local_1d8.super_ProString.m_string.d.ptr;
    local_188.size = local_1d8.super_ProString.m_string.d.size;
    MakefileGenerator::varGlue
              ((QString *)&local_1d8,&this->super_MakefileGenerator,(ProKey *)local_e8,
               &local_208.m_string,&local_168,(QString *)&local_188);
    ProString::ProString((ProString *)local_98,(QString *)&local_1d8);
    if (&(local_1d8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_1d8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_1d8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_1d8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_1d8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_188.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_188.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_188.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_188.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_188.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_168.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_168.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_168.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_168.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_168.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_208.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_208.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_208.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + -1;
      UNLOCK();
      if (((local_208.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
          == 0) {
        QArrayData::deallocate(&(local_208.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((QArrayData *)local_e8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_e8._0_8_,2,0x10);
      }
    }
    if (iStack_7c == 0) {
      ProString::ProString((ProString *)local_e8," $(DEFINES)");
      QString::operator=((QString *)local_98,(QString *)local_e8);
      unique0x10000915 = (undefined1 *)local_e8._24_8_;
      local_78 = puStack_c8;
      puStack_70 = local_c0;
      if ((QArrayData *)local_e8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_e8._0_8_,2,0x10);
        }
      }
    }
    MakefileGenerator::escapeDependencyPath
              ((ProString *)local_e8,&this->super_MakefileGenerator,(ProString *)local_68);
    pQVar8 = operator<<(t,(ProString *)local_e8);
    pQVar8 = (QTextStream *)QTextStream::operator<<(pQVar8,": ");
    MakefileGenerator::escapeDependencyPaths
              ((QStringList *)&local_188,&this->super_MakefileGenerator,(QStringList *)&local_148);
    local_1d8.super_ProString.m_string.d.d =
         (Data *)CONCAT62(local_1d8.super_ProString.m_string.d.d._2_6_,0x20);
    QtPrivate::QStringList_join((QList *)&local_168,(QChar *)&local_188,(longlong)&local_1d8);
    pQVar8 = (QTextStream *)QTextStream::operator<<(pQVar8,(QString *)&local_168);
    pQVar8 = (QTextStream *)QTextStream::operator<<(pQVar8,"\n\t");
    ProKey::ProKey(&local_1d8,"QMAKE_RC");
    (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0x16])
              (local_1a0,this,&local_1d8);
    pQVar8 = (QTextStream *)QTextStream::operator<<(pQVar8,(QString *)local_1a0);
    pQVar1 = (this->super_MakefileGenerator).project;
    QVar16.m_data = (storage_type *)0x5;
    QVar16.m_size = (qsizetype)&local_208;
    QString::fromUtf8(QVar16);
    pDVar2 = local_208.m_string.d.d;
    config.m_data = local_208.m_string.d.ptr;
    config.m_size = local_208.m_string.d.size;
    bVar5 = QMakeEvaluator::isActiveConfig(&pQVar1->super_QMakeEvaluator,config,false);
    if (bVar5) {
      pcVar12 = " -D_DEBUG";
    }
    pQVar8 = (QTextStream *)QTextStream::operator<<(pQVar8,pcVar12);
    pQVar8 = operator<<(pQVar8,(ProString *)local_98);
    pQVar8 = (QTextStream *)QTextStream::operator<<(pQVar8,(QString *)&local_128);
    pQVar8 = (QTextStream *)QTextStream::operator<<(pQVar8," -fo ");
    MakefileGenerator::escapeFilePath
              (&local_208,&this->super_MakefileGenerator,(ProString *)local_68);
    pQVar8 = operator<<(pQVar8,&local_208);
    pQVar8 = (QTextStream *)QTextStream::operator<<(pQVar8,' ');
    (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0xc])
              (local_220,this,&local_b8);
    QTextStream::operator<<(pQVar8,(QString *)local_220);
    if (local_220[0] != (QArrayData *)0x0) {
      LOCK();
      (local_220[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_220[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_220[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_220[0],2,0x10);
      }
    }
    if (&(local_208.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_208.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_208.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + -1;
      UNLOCK();
      if (((local_208.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
          == 0) {
        QArrayData::deallocate(&(local_208.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&pDVar2->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar2->super_QArrayData,2,0x10);
      }
    }
    if (local_1a0[0] != (QArrayData *)0x0) {
      LOCK();
      (local_1a0[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_1a0[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_1a0[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_1a0[0],2,0x10);
      }
    }
    if (&(local_1d8.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_1d8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_1d8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_1d8.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_1d8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_168.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_168.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_168.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_168.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_168.d.d)->super_QArrayData,2,0x10);
      }
    }
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_188);
    if ((QArrayData *)local_e8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_e8._0_8_,2,0x10);
      }
    }
    pQVar8 = (QTextStream *)Qt::endl(t);
    Qt::endl(pQVar8);
    if ((QArrayData *)local_98._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_98._0_8_,2,0x10);
      }
    }
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_148);
    if (local_128 != (QArrayData *)0x0) {
      LOCK();
      (local_128->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_128->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_128->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_128,2,0x10);
      }
    }
    QArrayDataPointer<ProString>::~QArrayDataPointer(&local_108);
    if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Win32MakefileGenerator::writeRcFilePart(QTextStream &t)
{
    if(!project->values("RC_FILE").isEmpty()) {
        const ProString res_file = project->first("RES_FILE");
        const QString rc_file = fileFixify(project->first("RC_FILE").toQString());

        const ProStringList rcIncPaths = project->values("RC_INCLUDEPATH");
        QString incPathStr;
        for (int i = 0; i < rcIncPaths.size(); ++i) {
            const ProString &path = rcIncPaths.at(i);
            if (path.isEmpty())
                continue;
            incPathStr += QStringLiteral(" /i ");
            incPathStr += escapeFilePath(path);
        }

        addSourceFile(rc_file, QMakeSourceFileInfo::SEEK_DEPS);
        const QStringList rcDeps = QStringList(rc_file) << dependencies(rc_file);

        // The resource tool may use defines. This might be the same defines passed in as the
        // compiler, since you may use these defines in the .rc file itself.
        // As the escape syntax for the command line defines for RC is different from that for CL,
        // we might have to set specific defines for RC.
        ProString defines = varGlue("RC_DEFINES", " -D", " -D", "");
        if (defines.isEmpty())
            defines = ProString(" $(DEFINES)");

        // Also, we need to add the _DEBUG define manually since the compiler defines this symbol
        // by itself, and we use it in the automatically created rc file when VERSION is defined
        // in the .pro file.
        t << escapeDependencyPath(res_file) << ": "
          << escapeDependencyPaths(rcDeps).join(' ') << "\n\t"
          << var("QMAKE_RC") << (project->isActiveConfig("debug") ? " -D_DEBUG" : "")
          << defines << incPathStr << " -fo " << escapeFilePath(res_file)
          << ' ' << escapeFilePath(rc_file);
        t << Qt::endl << Qt::endl;
    }
}